

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

char __thiscall
duckdb::Interpolator<true>::Operation<signed_char,signed_char,duckdb::QuantileDirect<signed_char>>
          (Interpolator<true> *this,char *v_t,Vector *result,QuantileDirect<signed_char> *accessor)

{
  RESULT_TYPE input;
  char cVar1;
  
  input = InterpolateInternal<signed_char,duckdb::QuantileDirect<signed_char>>(this,v_t,accessor);
  cVar1 = Cast::Operation<signed_char,signed_char>(input);
  return cVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}